

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

FederateState * __thiscall
helics::CommonCore::getFederateCore(CommonCore *this,GlobalFederateId federateID)

{
  bool bVar1;
  FederateState *pFVar2;
  BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**> fed;
  GlobalFederateId local_4c;
  BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**> local_48;
  const_iterator local_30;
  
  local_4c.gid = federateID.gid;
  gmlc::containers::
  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>::find
            (&local_48,&this->loopFederates,&local_4c);
  gmlc::containers::StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::end
            (&local_30,&(this->loopFederates).dataStorage);
  bVar1 = gmlc::containers::BlockIterator<helics::FedInfo,32,helics::FedInfo**>::operator!=
                    ((BlockIterator<helics::FedInfo,32,helics::FedInfo**> *)&local_48,&local_30);
  if (bVar1) {
    pFVar2 = (local_48.ptr)->fed;
  }
  else {
    pFVar2 = (FederateState *)0x0;
  }
  return pFVar2;
}

Assistant:

FederateState* CommonCore::getFederateCore(GlobalFederateId federateID)
{
    auto fed = loopFederates.find(federateID);
    return (fed != loopFederates.end()) ? (fed->fed) : nullptr;
}